

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * struct_union_enum_specifier
                  (dmr_C *C,type type,token *token,decl_state *ctx,
                  _func_token_ptr_dmr_C_ptr_token_ptr_symbol_ptr *parse)

{
  int iVar1;
  token *ptVar2;
  char *pcVar3;
  symbol *psVar4;
  position *repos;
  symbol *sym;
  _func_token_ptr_dmr_C_ptr_token_ptr_symbol_ptr *parse_local;
  decl_state *ctx_local;
  token *token_local;
  type type_local;
  dmr_C *C_local;
  
  ptVar2 = handle_attributes(C,token,ctx,8);
  if ((SUB84(ptVar2->pos,0) & 0x3f) != 2) {
    iVar1 = dmrC_match_op(ptVar2,0x7b);
    if (iVar1 == 0) {
      dmrC_sparse_error(C,ptVar2->pos,"expected declaration");
      (ctx->ctype).base_type = &C->S->bad_ctype;
      return ptVar2;
    }
    psVar4 = dmrC_alloc_symbol(C->S,ptVar2->pos,type);
    ptVar2 = (*parse)(C,ptVar2->next,psVar4);
    (ctx->ctype).base_type = psVar4;
    ptVar2 = dmrC_expect_token(C,ptVar2,0x7d,"at end of specifier");
    psVar4->endpos = ptVar2->pos;
    return ptVar2;
  }
  repos = (position *)dmrC_lookup_symbol((ptVar2->field_2).ident,NS_STRUCT);
  if (((symbol *)repos == (symbol *)0x0) ||
     ((iVar1 = dmrC_is_outer_scope(C,((symbol *)repos)->scope), iVar1 != 0 &&
      ((iVar1 = dmrC_match_op(ptVar2->next,0x3b), iVar1 != 0 ||
       (iVar1 = dmrC_match_op(ptVar2->next,0x7b), iVar1 != 0)))))) {
    repos = (position *)dmrC_alloc_symbol(C->S,ptVar2->pos,type);
    dmrC_bind_symbol(C->S,(symbol *)repos,(ptVar2->field_2).ident,NS_STRUCT);
  }
  if ((*(type *)repos & 0xff) == type) {
    (ctx->ctype).base_type = (symbol *)repos;
    ctx_local = (decl_state *)ptVar2->next;
    iVar1 = dmrC_match_op((token *)ctx_local,0x7b);
    if (iVar1 != 0) {
      if (repos[0x13] != (position)0x0) {
        pcVar3 = dmrC_show_typename(C,(symbol *)repos);
        dmrC_error_die(C,(position)(ctx_local->ctype).modifiers,"redefinition of %s",pcVar3);
      }
      *(position *)&repos->field_0x4 = ptVar2->pos;
      ptVar2 = (*parse)(C,(token *)(ctx_local->ctype).alignment,(symbol *)repos);
      ctx_local = (decl_state *)
                  dmrC_expect_token(C,ptVar2,0x7d,"at end of struct-union-enum-specifier");
      *(uint *)&repos[10].field_0x4 = *(uint *)&repos[10].field_0x4 & 0xffefffff;
      *(unsigned_long *)&repos[1].field_0x4 = (ctx_local->ctype).modifiers;
    }
    return (token *)ctx_local;
  }
  pcVar3 = dmrC_show_typename(C,(symbol *)repos);
  dmrC_error_die(C,ptVar2->pos,"invalid tag applied to %s",pcVar3);
}

Assistant:

static struct token *struct_union_enum_specifier(struct dmr_C *C, enum type type,
	struct token *token, struct decl_state *ctx,
	struct token *(*parse)(struct dmr_C *C, struct token *, struct symbol *))
{
	struct symbol *sym;
	struct position *repos;

	token = handle_attributes(C, token, ctx, KW_ATTRIBUTE);
	if (dmrC_token_type(token) == TOKEN_IDENT) {
		sym = dmrC_lookup_symbol(token->ident, NS_STRUCT);
		if (!sym ||
		    (dmrC_is_outer_scope(C, sym->scope) &&
		     (dmrC_match_op(token->next,';') || dmrC_match_op(token->next,'{')))) {
			// Either a new symbol, or else an out-of-scope
			// symbol being redefined.
			sym = dmrC_alloc_symbol(C->S, token->pos, type);
			dmrC_bind_symbol(C->S, sym, token->ident, NS_STRUCT);
		}
		if (sym->type != type)
			dmrC_error_die(C, token->pos, "invalid tag applied to %s", dmrC_show_typename (C, sym));
		ctx->ctype.base_type = sym;
		repos = &token->pos;
		token = token->next;
		if (dmrC_match_op(token, '{')) {
			// The following test is actually wrong for empty
			// structs, but (1) they are not C99, (2) gcc does
			// the same thing, and (3) it's easier.
			if (sym->symbol_list)
				dmrC_error_die(C, token->pos, "redefinition of %s", dmrC_show_typename (C, sym));
			sym->pos = *repos;
			token = parse(C, token->next, sym);
			token = dmrC_expect_token(C, token, '}', "at end of struct-union-enum-specifier");

			// Mark the structure as needing re-examination
			sym->examined = 0;
			sym->endpos = token->pos;
		}
		return token;
	}

	// private struct/union/enum type
	if (!dmrC_match_op(token, '{')) {
		dmrC_sparse_error(C, token->pos, "expected declaration");
		ctx->ctype.base_type = &C->S->bad_ctype;
		return token;
	}

	sym = dmrC_alloc_symbol(C->S, token->pos, type);
	token = parse(C, token->next, sym);
	ctx->ctype.base_type = sym;
	token =  dmrC_expect_token(C, token, '}', "at end of specifier");
	sym->endpos = token->pos;

	return token;
}